

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall maths::Matrix::inverse(Matrix *this)

{
  double dVar1;
  double *pdVar2;
  double **extraout_RDX;
  long in_RSI;
  Matrix *in_RDI;
  Matrix MVar3;
  Matrix *in_stack_00000028;
  Matrix *in_stack_00000038;
  int j;
  int i;
  Matrix IAInverse;
  Matrix U;
  Matrix AI;
  Matrix I;
  Matrix *AInverse;
  Matrix *in_stack_ffffffffffffff48;
  Matrix *in_stack_ffffffffffffff50;
  int local_8c;
  int local_88;
  Matrix local_80 [2];
  Matrix *in_stack_ffffffffffffffa0;
  Matrix *in_stack_ffffffffffffffa8;
  
  createIdentity((int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  Matrix(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  Matrix(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  augment(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ~Matrix(in_stack_ffffffffffffff50);
  ~Matrix(in_stack_ffffffffffffff50);
  gaussianEliminate(in_stack_00000028);
  rowReduceFromGaussian(in_stack_00000038);
  Matrix(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
         (int)in_stack_ffffffffffffff48);
  for (local_88 = 0; local_88 < in_RDI->rows_; local_88 = local_88 + 1) {
    for (local_8c = 0; local_8c < in_RDI->cols_; local_8c = local_8c + 1) {
      in_stack_ffffffffffffff50 =
           (Matrix *)operator()(local_80,local_88,local_8c + *(int *)(in_RSI + 4));
      dVar1 = *(double *)in_stack_ffffffffffffff50;
      pdVar2 = operator()(in_RDI,local_88,local_8c);
      *pdVar2 = dVar1;
    }
  }
  ~Matrix(in_stack_ffffffffffffff50);
  ~Matrix(in_stack_ffffffffffffff50);
  ~Matrix(in_stack_ffffffffffffff50);
  ~Matrix(in_stack_ffffffffffffff50);
  MVar3.p = extraout_RDX;
  MVar3._0_8_ = in_RDI;
  return MVar3;
}

Assistant:

Matrix Matrix::inverse()
{
    Matrix I = Matrix::createIdentity(rows_);
    Matrix AI = Matrix::augment(*this, I);
    Matrix U = AI.gaussianEliminate();
    Matrix IAInverse = U.rowReduceFromGaussian();
    Matrix AInverse(rows_, cols_);
    for (int i = 0; i < AInverse.rows_; ++i) {
        for (int j = 0; j < AInverse.cols_; ++j) {
            AInverse(i, j) = IAInverse(i, j + cols_);
        }
    }
    return AInverse;
}